

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapBase.h
# Opt level: O1

void __thiscall
Eigen::
DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>const>>
::
visit<Eigen::internal::max_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>const>>>
          (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>const>>
           *this,max_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
                 *visitor)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Scalar *pSVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  Scalar SVar8;
  double dVar9;
  
  pSVar4 = *(Scalar **)this;
  dVar7 = ABS(*pSVar4);
  (visitor->
  super_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
  ).res = dVar7;
  (visitor->
  super_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
  ).row = 0;
  (visitor->
  super_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
  ).col = 0;
  lVar1 = *(long *)(this + 8);
  if (1 < lVar1) {
    lVar3 = 1;
    do {
      dVar9 = ABS(pSVar4[lVar3]);
      if (dVar7 < dVar9) {
        (visitor->
        super_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
        ).res = dVar9;
        (visitor->
        super_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
        ).row = lVar3;
        (visitor->
        super_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
        ).col = 0;
        dVar7 = dVar9;
      }
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
  }
  lVar3 = *(long *)(this + 0x10);
  if (1 < lVar3) {
    SVar8 = (visitor->
            super_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
            ).res;
    lVar2 = *(long *)(this + 0x20);
    lVar5 = 1;
    do {
      pSVar4 = pSVar4 + lVar2;
      if (0 < lVar1) {
        lVar6 = 0;
        do {
          dVar7 = ABS(pSVar4[lVar6]);
          if (SVar8 < dVar7) {
            (visitor->
            super_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
            ).res = dVar7;
            (visitor->
            super_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
            ).row = lVar6;
            (visitor->
            super_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
            ).col = lVar5;
            SVar8 = dVar7;
          }
          lVar6 = lVar6 + 1;
        } while (lVar1 != lVar6);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar3);
  }
  return;
}

Assistant:

inline const Scalar& coeff(Index rowId, Index colId) const
    {
      return m_data[colId * colStride() + rowId * rowStride()];
    }